

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O3

void __thiscall
rtosc::helpers::CapturePretty::reply_va(CapturePretty *this,char *args,__va_list_tag *va)

{
  int cols_used;
  char *buffer;
  size_t bs;
  long lVar1;
  size_t nargs;
  rtosc_arg_val_t *args_00;
  undefined8 auStack_40 [2];
  
  auStack_40[0] = 0x10ba23;
  nargs = strlen(args);
  lVar1 = -(nargs * 0x18 + 0xf & 0xfffffffffffffff0);
  args_00 = (rtosc_arg_val_t *)((long)auStack_40 + lVar1 + 8);
  *(undefined8 *)((long)auStack_40 + lVar1) = 0x10ba50;
  rtosc_v2argvals(args_00,nargs,args,va);
  buffer = this->buffer;
  bs = this->buffersize;
  cols_used = this->cols_used;
  *(undefined8 *)((long)auStack_40 + lVar1) = 0x10ba70;
  rtosc_print_arg_vals(args_00,nargs,buffer,bs,(rtosc_print_options *)0x0,cols_used);
  return;
}

Assistant:

void reply_va(const char *args, va_list va)
    {
        size_t nargs = strlen(args);
        STACKALLOC(rtosc_arg_val_t, arg_vals, nargs);

        rtosc_v2argvals(arg_vals, nargs, args, va);

        size_t wrt = rtosc_print_arg_vals(arg_vals, nargs,
                                          buffer, buffersize, NULL,
                                          cols_used);
        assert(wrt);
        (void)wrt;
    }